

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_value.cpp
# Opt level: O1

ScalarFunction * duckdb::ListValueFun::GetFunction(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  ScalarFunction *in_RDI;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  LogicalType local_d0;
  undefined1 local_cf;
  undefined8 local_c8;
  undefined8 uStack_c0;
  code *local_b8;
  undefined8 uStack_b0;
  code *local_a8;
  code *pcStack_a0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_98;
  LogicalType local_80 [24];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  LogicalType local_38 [24];
  
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"list_value","");
  local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duckdb::LogicalType::LogicalType(local_80,LIST);
  uStack_b0 = 0;
  local_b8 = ListValueFunction;
  pcStack_a0 = std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  duckdb::LogicalType::LogicalType(local_38,INVALID);
  duckdb::ScalarFunction::ScalarFunction();
  duckdb::LogicalType::~LogicalType(local_38);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,3);
  }
  duckdb::LogicalType::~LogicalType(local_80);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_98);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  duckdb::LogicalType::LogicalType(&local_d0,ANY);
  uVar3 = uStack_c0;
  uVar2 = local_c8;
  in_RDI->field_0x78 = local_d0;
  in_RDI->field_0x79 = local_cf;
  uVar4 = *(undefined4 *)&in_RDI->field_0x80;
  uVar6 = *(undefined4 *)&in_RDI->field_0x88;
  *(undefined8 *)&in_RDI->field_0x80 = 0;
  *(undefined8 *)&in_RDI->field_0x88 = 0;
  local_c8 = 0;
  uStack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&in_RDI->field_0x88;
  *(undefined8 *)&in_RDI->field_0x80 = uVar2;
  *(undefined8 *)&in_RDI->field_0x88 = uVar3;
  uVar5 = *(undefined4 *)&in_RDI->field_0x84;
  uVar7 = *(undefined4 *)&in_RDI->field_0x8c;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_48 = uVar4;
    uStack_44 = *(undefined4 *)&in_RDI->field_0x84;
    uStack_40 = uVar6;
    uStack_3c = *(undefined4 *)&in_RDI->field_0x8c;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    uVar4 = local_48;
    uVar5 = uStack_44;
    uVar6 = uStack_40;
    uVar7 = uStack_3c;
  }
  p_Var1 = uStack_c0;
  local_c8 = CONCAT44(uVar5,uVar4);
  uStack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uVar7,uVar6);
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  duckdb::LogicalType::~LogicalType(&local_d0);
  in_RDI->field_0xa9 = 1;
  return in_RDI;
}

Assistant:

ScalarFunction ListValueFun::GetFunction() {
	// the arguments and return types are actually set in the binder function
	ScalarFunction fun("list_value", {}, LogicalTypeId::LIST, ListValueFunction, ListValueBind, nullptr,
	                   ListValueStats);
	fun.varargs = LogicalType::ANY;
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	return fun;
}